

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O2

stb_vorbis *
stb_vorbis_open_file_section
          (FILE *file,int close_on_free,int *error,stb_vorbis_alloc *alloc,uint length)

{
  int iVar1;
  long lVar2;
  stb_vorbis *f;
  vorb vStack_798;
  
  memset(&vStack_798,0,0x770);
  if (alloc != (stb_vorbis_alloc *)0x0) {
    vStack_798.alloc.alloc_buffer = alloc->alloc_buffer;
    vStack_798.alloc.alloc_buffer_length_in_bytes =
         (int)*(ulong *)&alloc->alloc_buffer_length_in_bytes;
    vStack_798.temp_offset = vStack_798.alloc.alloc_buffer_length_in_bytes & 0xfffffff8;
    vStack_798.alloc._8_8_ = *(ulong *)&alloc->alloc_buffer_length_in_bytes & 0xfffffffffffffff8;
  }
  vStack_798.eof = 0;
  vStack_798.error = VORBIS__no_error;
  vStack_798.stream = (uint8 *)0x0;
  vStack_798.codebooks = (Codebook *)0x0;
  vStack_798.page_crc_tests = -1;
  vStack_798.f = file;
  lVar2 = ftell((FILE *)file);
  vStack_798.f_start = (uint32)lVar2;
  vStack_798.close_on_free = close_on_free;
  vStack_798.stream_len = length;
  iVar1 = start_decoder(&vStack_798);
  if ((iVar1 != 0) && (f = vorbis_alloc(&vStack_798), f != (stb_vorbis *)0x0)) {
    memcpy(f,&vStack_798,0x770);
    vorbis_pump_first_frame(f);
    return f;
  }
  if (error != (int *)0x0) {
    *error = vStack_798.error;
  }
  vorbis_deinit(&vStack_798);
  return (stb_vorbis *)0x0;
}

Assistant:

stb_vorbis * stb_vorbis_open_file_section(FILE *file, int close_on_free, int *error, const stb_vorbis_alloc *alloc, unsigned int length)
{
   stb_vorbis *f, p;
   vorbis_init(&p, alloc);
   p.f = file;
   p.f_start = (uint32) ftell(file);
   p.stream_len   = length;
   p.close_on_free = close_on_free;
   if (start_decoder(&p)) {
      f = vorbis_alloc(&p);
      if (f) {
         *f = p;
         vorbis_pump_first_frame(f);
         return f;
      }
   }
   if (error) *error = p.error;
   vorbis_deinit(&p);
   return NULL;
}